

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O2

LY_ERR lysp_stmt_type_reqinstance
                 (lysp_ctx *ctx,lysp_stmt *stmt,uint8_t *reqinst,uint16_t *flags,
                 lysp_ext_instance **exts)

{
  lysp_stmt *stmt_00;
  LY_ERR LVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  ly_ctx *plVar5;
  lysp_stmt **pplVar6;
  
  if ((*flags >> 9 & 1) != 0) {
    if (ctx == (lysp_ctx *)0x0) {
      plVar5 = (ly_ctx *)0x0;
    }
    else {
      plVar5 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_vlog(plVar5,(char *)0x0,LYVE_SYNTAX_YANG,"Duplicate keyword \"%s\".","require-instance");
    return LY_EVALID;
  }
  *flags = *flags | 0x200;
  LVar1 = lysp_stmt_validate_value(ctx,Y_STR_ARG,stmt->arg);
  if (LVar1 != LY_SUCCESS) {
    return LVar1;
  }
  pcVar4 = stmt->arg;
  sVar3 = strlen(pcVar4);
  if ((int)sVar3 == 5) {
    iVar2 = strncmp(pcVar4,"false",5);
    if (iVar2 == 0) goto LAB_001696e0;
  }
  else if (((int)sVar3 == 4) && (iVar2 = strncmp(pcVar4,"true",4), iVar2 == 0)) {
    *reqinst = '\x01';
LAB_001696e0:
    pplVar6 = &stmt->child;
    while( true ) {
      stmt_00 = *pplVar6;
      if (stmt_00 == (lysp_stmt *)0x0) {
        return LY_SUCCESS;
      }
      if (stmt_00->kw != LY_STMT_EXTENSION_INSTANCE) break;
      LVar1 = lysp_stmt_ext(ctx,stmt_00,LY_STMT_REQUIRE_INSTANCE,0,exts);
      pplVar6 = &stmt_00->next;
      if (LVar1 != LY_SUCCESS) {
        return LVar1;
      }
    }
    if (ctx == (lysp_ctx *)0x0) {
      plVar5 = (ly_ctx *)0x0;
    }
    else {
      plVar5 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    pcVar4 = lyplg_ext_stmt2str(stmt_00->kw);
    ly_vlog(plVar5,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid keyword \"%s\" as a child of \"%s\".",
            pcVar4,"require-instance");
    return LY_EVALID;
  }
  if (ctx == (lysp_ctx *)0x0) {
    plVar5 = (ly_ctx *)0x0;
  }
  else {
    plVar5 = (ly_ctx *)
             **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
  }
  ly_vlog(plVar5,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid value \"%.*s\" of \"%s\".",sVar3 & 0xffffffff
          ,pcVar4,"require-instance");
  return LY_EVALID;
}

Assistant:

static LY_ERR
lysp_stmt_type_reqinstance(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, uint8_t *reqinst, uint16_t *flags,
        struct lysp_ext_instance **exts)
{
    int arg_len;

    if (*flags & LYS_SET_REQINST) {
        LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, "require-instance");
        return LY_EVALID;
    }
    *flags |= LYS_SET_REQINST;

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_STR_ARG, stmt->arg));
    arg_len = strlen(stmt->arg);
    if ((arg_len == ly_strlen_const("true")) && !strncmp(stmt->arg, "true", arg_len)) {
        *reqinst = 1;
    } else if ((arg_len != ly_strlen_const("false")) || strncmp(stmt->arg, "false", arg_len)) {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, arg_len, stmt->arg, "require-instance");
        return LY_EVALID;
    }

    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, LY_STMT_REQUIRE_INSTANCE, 0, exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), "require-instance");
            return LY_EVALID;
        }
    }
    return LY_SUCCESS;
}